

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_descriptor.c
# Opt level: O1

plugin_descriptor plugin_descriptor_create(char *path,char *library_name,char *symbol_iface_name)

{
  int iVar1;
  plugin_descriptor descriptor;
  dynlink pdVar2;
  undefined8 uVar3;
  char *pcVar4;
  dynlink_symbol_addr address;
  char *pcVar5;
  _func_void_ptr *local_28;
  
  descriptor = (plugin_descriptor)malloc(0x20);
  if (descriptor == (plugin_descriptor)0x0) {
    log_write_impl_va("metacall",0x23,"plugin_descriptor_create",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_descriptor.c"
                      ,3,"Invalid plugin descriptor allocation");
  }
  else {
    descriptor->handle = (dynlink)0x0;
    descriptor->library_name = library_name;
    descriptor->symbol_iface_name = symbol_iface_name;
    descriptor->iface_singleton = (_func_void_ptr *)0x0;
    pcVar5 = library_name;
    log_write_impl_va("metacall",0x2c,"plugin_descriptor_create",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_descriptor.c"
                      ,0,"Loading plugin: %s",library_name);
    pdVar2 = (dynlink)dynlink_load(path,library_name,10);
    if (pdVar2 == (dynlink)0x0) {
      pcVar4 = "Failed to load library from plugin descriptor";
      uVar3 = 0x32;
    }
    else {
      descriptor->handle = pdVar2;
      pcVar5 = symbol_iface_name;
      log_write_impl_va("metacall",0x39,"plugin_descriptor_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_descriptor.c"
                        ,0,"Loading plugin symbol: %s",symbol_iface_name);
      iVar1 = dynlink_symbol(pdVar2,symbol_iface_name,&local_28);
      if (iVar1 == 0) {
        descriptor->iface_singleton = local_28;
        if (local_28 != (_func_void_ptr *)0x0) {
          return descriptor;
        }
        pcVar4 = "Invalid plugin descriptor dynlink symbol access";
        uVar3 = 0x48;
      }
      else {
        pcVar4 = "Invalid plugin descriptor dynlink symbol loading";
        uVar3 = 0x3f;
      }
    }
    log_write_impl_va("metacall",uVar3,"plugin_descriptor_create",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_descriptor.c"
                      ,3,pcVar4,pcVar5);
    plugin_descriptor_destroy(descriptor);
  }
  return (plugin_descriptor)0x0;
}

Assistant:

plugin_descriptor plugin_descriptor_create(char *path, char *library_name, char *symbol_iface_name)
{
	plugin_descriptor descriptor = malloc(sizeof(struct plugin_descriptor_type));

	if (descriptor == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin descriptor allocation");
		return NULL;
	}

	descriptor->handle = NULL;
	descriptor->library_name = library_name;
	descriptor->symbol_iface_name = symbol_iface_name;
	descriptor->iface_singleton = NULL;

	log_write("metacall", LOG_LEVEL_DEBUG, "Loading plugin: %s", library_name);

	dynlink handle = dynlink_load(path, library_name, DYNLINK_FLAGS_BIND_LAZY | DYNLINK_FLAGS_BIND_GLOBAL);

	if (handle == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Failed to load library from plugin descriptor");
		plugin_descriptor_destroy(descriptor);
		return NULL;
	}

	descriptor->handle = handle;

	log_write("metacall", LOG_LEVEL_DEBUG, "Loading plugin symbol: %s", symbol_iface_name);

	dynlink_symbol_addr address;

	if (dynlink_symbol(handle, symbol_iface_name, &address) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin descriptor dynlink symbol loading");
		plugin_descriptor_destroy(descriptor);
		return NULL;
	}

	descriptor->iface_singleton = (void *(*)(void))(address);

	if (descriptor->iface_singleton == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin descriptor dynlink symbol access");
		plugin_descriptor_destroy(descriptor);
		return NULL;
	}

	return descriptor;
}